

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaHash.c
# Opt level: O3

Vec_Int_t * Pla_ManComputeDistance1Int(Pla_Man_t *p)

{
  int *piVar1;
  ushort uVar2;
  uint uVar3;
  uint Entry;
  uint uVar4;
  uint Entry_00;
  int iVar;
  Vec_Int_t *pVVar5;
  bool bVar6;
  uint uVar7;
  Vec_Int_t *vRes;
  int *piVar8;
  Vec_Int_t *vRes_00;
  Vec_Int_t *p_00;
  void *__s;
  Vec_Int_t *p_01;
  Tab_Man_t *pTab;
  Tab_Obj_t *pTVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  ulong local_78;
  
  vRes = (Vec_Int_t *)malloc(0x10);
  vRes->nCap = 100;
  vRes->nSize = 0;
  piVar8 = (int *)malloc(400);
  vRes->pArray = piVar8;
  vRes_00 = (Vec_Int_t *)malloc(0x10);
  vRes_00->nCap = 100;
  vRes_00->nSize = 0;
  piVar8 = (int *)malloc(400);
  vRes_00->pArray = piVar8;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar8 = (int *)malloc(4000);
  p_00->pArray = piVar8;
  uVar3 = (p->vCubeLits).nSize;
  lVar13 = (long)(int)uVar3;
  uVar7 = uVar3;
  if (uVar3 - 1 < 0xf) {
    uVar7 = 0x10;
  }
  if (uVar7 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar7 << 2);
  }
  piVar8 = (int *)0x0;
  memset(__s,0,lVar13 * 4);
  iVar20 = p->nIns;
  p_01 = (Vec_Int_t *)malloc(0x10);
  if (iVar20 - 1U < 0xf) {
    iVar20 = 0x10;
  }
  p_01->nCap = iVar20;
  if (iVar20 != 0) {
    piVar8 = (int *)malloc((long)iVar20 << 2);
  }
  p_01->pArray = piVar8;
  if (0 < (int)uVar3) {
    lVar16 = 0;
    uVar7 = 0;
    do {
      uVar7 = uVar7 + *(int *)((long)&((p->vCubeLits).pArray)->nSize + lVar16);
      lVar16 = lVar16 + 0x10;
    } while (lVar13 << 4 != lVar16);
    uVar14 = 0x1f;
    if (uVar7 - 1 != 0) {
      for (; uVar7 - 1 >> uVar14 == 0; uVar14 = uVar14 - 1) {
      }
    }
    uVar14 = (uVar14 ^ 0xffffffe0) + 0x21;
    if (uVar7 < 2) {
      uVar14 = uVar7;
    }
    if (0x18 < (int)uVar14) {
      __assert_fail("nBits <= 26",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaHash.c"
                    ,0x115,"Vec_Int_t *Pla_ManComputeDistance1Int(Pla_Man_t *)");
    }
    pTab = (Tab_Man_t *)calloc(1,0x18);
    if (1 < (int)uVar14) {
      uVar7 = 4 << ((byte)uVar14 & 0x1f);
      pTab->SizeMask = uVar7 - 1;
      pTVar9 = (Tab_Obj_t *)calloc((ulong)uVar7,0x10);
      pTab->pBins = pTVar9;
      pTab->nBins = 1;
      pTab->pMan = p;
      Pla_ManHashCubes2(p,pTab);
      uVar7 = pTab->SizeMask;
      if (-1 < (int)uVar7) {
        pTVar9 = pTab->pBins;
        uVar14 = 0;
        do {
          p_01->nSize = 0;
          if ((pTVar9 != (Tab_Obj_t *)0x0) && (iVar20 = pTVar9[uVar7 & uVar14].Table, iVar20 != 0))
          {
            do {
              uVar2 = *(ushort *)&pTVar9[iVar20].field_0xc;
              Vec_IntPush(p_01,pTVar9[iVar20].Cube);
              Vec_IntPush(p_01,(uint)uVar2);
              iVar20 = pTVar9[iVar20].Next;
            } while (iVar20 != 0);
            uVar17 = (ulong)p_01->nSize;
            if (1 < (long)uVar17) {
              uVar18 = (ulong)((uint)p_01->nSize >> 1);
              local_78 = 1;
              uVar10 = 0;
              do {
                uVar11 = uVar10 + 1;
                if (uVar11 < uVar18) {
                  if (uVar17 <= uVar10 * 2) {
LAB_0036e69b:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                  }
                  piVar8 = p_01->pArray;
                  uVar15 = local_78;
                  do {
                    if ((uVar17 <= uVar15 * 2) || (uVar12 = uVar15 * 2 | 1, uVar17 <= uVar12))
                    goto LAB_0036e69b;
                    Entry = piVar8[uVar10 * 2];
                    if (((int)Entry < 0) || (uVar4 = (p->vCubeLits).nSize, (int)uVar4 <= (int)Entry)
                       ) {
LAB_0036e67c:
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                                    ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
                    }
                    Entry_00 = piVar8[uVar15 * 2];
                    uVar19 = (ulong)Entry_00;
                    if (((int)Entry_00 < 0) || (uVar4 <= Entry_00)) goto LAB_0036e67c;
                    pVVar5 = (p->vCubeLits).pArray;
                    if (pVVar5[Entry].nSize == pVVar5[uVar19].nSize) {
                      iVar20 = piVar8[uVar10 * 2 | 1];
                      iVar = piVar8[uVar12];
                      Vec_IntCopySkip(pVVar5 + Entry,iVar20,vRes);
                      Vec_IntCopySkip(pVVar5 + uVar19,iVar,vRes_00);
                      uVar4 = vRes->nSize;
                      if (uVar4 == vRes_00->nSize) {
                        if (0 < (int)uVar4) {
                          uVar12 = 0;
                          do {
                            if (vRes->pArray[uVar12] != vRes_00->pArray[uVar12]) goto LAB_0036e568;
                            uVar12 = uVar12 + 1;
                          } while (uVar4 != uVar12);
                        }
                        printf("%d %d  ",(ulong)Entry,(ulong)Entry_00);
                        Vec_IntPush(p_00,Entry);
                        Vec_IntPush(p_00,iVar20);
                        Vec_IntPush(p_00,Entry_00);
                        Vec_IntPush(p_00,iVar);
                        if (((int)uVar3 <= (int)Entry) ||
                           (piVar1 = (int *)((long)__s + (ulong)Entry * 4), *piVar1 = *piVar1 + 1,
                           (int)uVar3 <= (int)Entry_00)) {
                          __assert_fail("i >= 0 && i < p->nSize",
                                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                        ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
                        }
                        piVar1 = (int *)((long)__s + uVar19 * 4);
                        *piVar1 = *piVar1 + 1;
                      }
                    }
LAB_0036e568:
                    uVar15 = uVar15 + 1;
                  } while (uVar15 < uVar18);
                }
                local_78 = local_78 + 1;
                uVar10 = uVar11;
              } while (uVar11 != uVar18);
            }
          }
          bVar6 = (int)uVar14 < (int)uVar7;
          uVar14 = uVar14 + 1;
        } while (bVar6);
      }
      printf("Vector has %d entries: {",(ulong)uVar3);
      lVar16 = 0;
      do {
        printf(" %d",(ulong)*(uint *)((long)__s + lVar16 * 4));
        lVar16 = lVar16 + 1;
      } while (lVar13 != lVar16);
      puts(" }");
      free(__s);
      if (vRes->pArray != (int *)0x0) {
        free(vRes->pArray);
      }
      free(vRes);
      if (vRes_00->pArray != (int *)0x0) {
        free(vRes_00->pArray);
      }
      free(vRes_00);
      if (p_01->pArray != (int *)0x0) {
        free(p_01->pArray);
      }
      free(p_01);
      if (pTab->pBins != (Tab_Obj_t *)0x0) {
        free(pTab->pBins);
      }
      free(pTab);
      return p_00;
    }
  }
  __assert_fail("LogSize >= 4 && LogSize <= 26",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaHash.c"
                ,0x6e,"Tab_Man_t *Tab_ManAlloc(int, Pla_Man_t *)");
}

Assistant:

Vec_Int_t * Pla_ManComputeDistance1Int( Pla_Man_t * p )
{
    Tab_Man_t * pTab;
    Vec_Int_t * vCube1, * vCube2;
    Vec_Int_t * vTemp1 = Vec_IntAlloc( 100 );
    Vec_Int_t * vTemp2 = Vec_IntAlloc( 100 );
    Vec_Int_t * vPairs = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCounts = Vec_IntStart( Vec_WecSize(&p->vCubeLits) );
    Vec_Int_t * vEntries = Vec_IntAlloc( p->nIns );
    int nBits = Abc_Base2Log( Vec_WecSizeSize(&p->vCubeLits) ) + 2;
    int v, i, k;//, Count = 0;
    int iCube1, iCube2, iVar1, iVar2;
    assert( nBits <= 26 );
    pTab = Tab_ManAlloc( nBits, p );
    //Pla_ManConvertFromBits( p );
    Pla_ManHashCubes2( p, pTab );
    // iterate through the hash bins
    for ( v = 0; v <= pTab->SizeMask; v++ )
    {
        Tab_ManHashCollect( pTab, v, vEntries );
        for ( i = 0; i < Vec_IntSize(vEntries)/2; i++ )
        for ( k = i+1; k < Vec_IntSize(vEntries)/2; k++ )
        {
            iCube1 = Vec_IntEntry(vEntries, 2*i);
            iCube2 = Vec_IntEntry(vEntries, 2*k);
            iVar1 = Vec_IntEntry(vEntries, 2*i+1);
            iVar2 = Vec_IntEntry(vEntries, 2*k+1);

            vCube1 = Vec_WecEntry(&p->vCubeLits, iCube1);
            vCube2 = Vec_WecEntry(&p->vCubeLits, iCube2);
/*
            Pla_PrintCube( vCube1, p->nIns, iVar1 );
            Pla_PrintCube( vCube2, p->nIns, iVar2 );
            printf( "\n" );
*/
            if ( Vec_IntSize(vCube1) != Vec_IntSize(vCube2) )
                continue;
            Vec_IntCopySkip( vCube1, iVar1, vTemp1 );
            Vec_IntCopySkip( vCube2, iVar2, vTemp2 );
            if ( !Vec_IntEqual( vTemp1, vTemp2 ) )
                continue;

            printf( "%d %d  ", iCube1, iCube2 );

            Vec_IntPushTwo( vPairs, iCube1, iVar1 );
            Vec_IntPushTwo( vPairs, iCube2, iVar2 );

            Vec_IntAddToEntry( vCounts, iCube1, 1 );
            Vec_IntAddToEntry( vCounts, iCube2, 1 );
        }
    }
    Vec_IntPrint( vCounts );

    Vec_IntFree( vCounts );
    Vec_IntFree( vTemp1 );
    Vec_IntFree( vTemp2 );
    Vec_IntFree( vEntries );
    Tab_ManFree( pTab );
    return vPairs;
}